

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxminddb.c
# Opt level: O0

int map_file(MMDB_s *mmdb)

{
  int iVar1;
  uint8_t *puVar2;
  int *piVar3;
  int saved_errno;
  uint8_t *file_content;
  off_t size;
  stat_conflict s;
  int fd;
  int o_flags;
  int status;
  MMDB_s *mmdb_local;
  
  fd = 0;
  s.__glibc_reserved[2]._4_4_ = open(mmdb->filename,0x80000);
  if (s.__glibc_reserved[2]._4_4_ < 0) {
    fd = 1;
  }
  else {
    iVar1 = fstat(s.__glibc_reserved[2]._4_4_,(stat *)&size);
    if (iVar1 == 0) {
      if (((long)s.st_rdev < 0) || (0x7fffffffffffffff < (long)s.st_rdev)) {
        fd = 5;
      }
      else {
        puVar2 = (uint8_t *)mmap((void *)0x0,s.st_rdev,1,1,s.__glibc_reserved[2]._4_4_,0);
        if (puVar2 == (uint8_t *)0xffffffffffffffff) {
          piVar3 = __errno_location();
          if (*piVar3 == 0xc) {
            fd = 5;
          }
          else {
            fd = 4;
          }
        }
        else {
          mmdb->file_size = s.st_rdev;
          mmdb->file_content = puVar2;
        }
      }
    }
    else {
      fd = 1;
    }
  }
  piVar3 = __errno_location();
  iVar1 = *piVar3;
  if (-1 < s.__glibc_reserved[2]._4_4_) {
    close(s.__glibc_reserved[2]._4_4_);
  }
  piVar3 = __errno_location();
  *piVar3 = iVar1;
  return fd;
}

Assistant:

static int map_file(MMDB_s *const mmdb) {
    int status = MMDB_SUCCESS;

    int o_flags = O_RDONLY;
#ifdef O_CLOEXEC
    o_flags |= O_CLOEXEC;
#endif
    int fd = open(mmdb->filename, o_flags);
    if (fd < 0) {
        status = MMDB_FILE_OPEN_ERROR;
        goto cleanup;
    }

#if defined(FD_CLOEXEC) && !defined(O_CLOEXEC)
    int fd_flags = fcntl(fd, F_GETFD);
    if (fd_flags >= 0) {
        fcntl(fd, F_SETFD, fd_flags | FD_CLOEXEC);
    }
#endif

    struct stat s;
    if (fstat(fd, &s)) {
        status = MMDB_FILE_OPEN_ERROR;
        goto cleanup;
    }

    off_t size = s.st_size;
    if (size < 0 || size > SSIZE_MAX) {
        status = MMDB_OUT_OF_MEMORY_ERROR;
        goto cleanup;
    }

    uint8_t *file_content =
        (uint8_t *)mmap(NULL, (size_t)size, PROT_READ, MAP_SHARED, fd, 0);
    if (MAP_FAILED == file_content) {
        if (ENOMEM == errno) {
            status = MMDB_OUT_OF_MEMORY_ERROR;
        } else {
            status = MMDB_IO_ERROR;
        }
        goto cleanup;
    }

    mmdb->file_size = (ssize_t)size;
    mmdb->file_content = file_content;

cleanup:;
    int saved_errno = errno;
    if (fd >= 0) {
        close(fd);
    }
    errno = saved_errno;

    return status;
}